

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall
GlobOpt::CaptureCopyPropValue
          (GlobOpt *this,BasicBlock *block,Sym *sym,Value *val,EditingIterator *bailOutCopySymsIter)

{
  JitArenaAllocator *allocator;
  StackSym *param2;
  StackSym *param1;
  
  if (sym->m_kind == SymKindStack) {
    param2 = GlobOptBlockData::GetCopyPropSym(&block->globOptData,sym,val);
    if (param2 != (StackSym *)0x0) {
      allocator = this->func->m_alloc;
      param1 = Sym::AsStackSym(sym);
      SListBase<JsUtil::KeyValuePair<StackSym*,StackSym*>,Memory::ArenaAllocator,RealCount>::
      EditingIterator::InsertNodeBefore<StackSym*,StackSym*>
                ((EditingIterator *)bailOutCopySymsIter,&allocator->super_ArenaAllocator,param1,
                 param2);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::CaptureCopyPropValue(BasicBlock * block, Sym * sym, Value * val, SListBase<CopyPropSyms>::EditingIterator & bailOutCopySymsIter)
{
    if (!sym->IsStackSym())
    {
        return;
    }

    StackSym * copyPropSym = block->globOptData.GetCopyPropSym(sym, val);
    if (copyPropSym != nullptr)
    {
        bailOutCopySymsIter.InsertNodeBefore(this->func->m_alloc, sym->AsStackSym(), copyPropSym);
    }
}